

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NULL.c
# Opt level: O3

int NULL_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
              void *app_key)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (sptr == (void *)0x0) {
    pcVar3 = "<absent>";
    sVar2 = 8;
  }
  else {
    pcVar3 = "<present>";
    sVar2 = 9;
  }
  iVar1 = (*cb)(pcVar3,sVar2,app_key);
  return iVar1 >> 0x1f;
}

Assistant:

int
NULL_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
	asn_app_consume_bytes_f *cb, void *app_key) {

	(void)td;	/* Unused argument */
	(void)ilevel;	/* Unused argument */

	if(sptr) {
		return (cb("<present>", 9, app_key) < 0) ? -1 : 0;
	} else {
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;
	}
}